

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O3

void __thiscall
spv::Builder::dumpSourceInstructions
          (Builder *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *out)

{
  _Rb_tree_node_base *p_Var1;
  
  if (this->emitNonSemanticShaderDebugInfo == false) {
    dumpSourceInstructions(this,this->mainFileId,&this->sourceText,out);
    for (p_Var1 = (this->includeFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var1 != &(this->includeFiles)._M_t._M_impl.super__Rb_tree_header;
        p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
      dumpSourceInstructions(this,p_Var1[1]._M_color,(string *)p_Var1[1]._M_parent,out);
    }
  }
  return;
}

Assistant:

void Builder::dumpSourceInstructions(std::vector<unsigned int>& out) const
{
    if (emitNonSemanticShaderDebugInfo) return;
    dumpSourceInstructions(mainFileId, sourceText, out);
    for (auto iItr = includeFiles.begin(); iItr != includeFiles.end(); ++iItr)
        dumpSourceInstructions(iItr->first, *iItr->second, out);
}